

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall
cmGeneratedFileStream::WriteAltEncoding(cmGeneratedFileStream *this,string *data,Encoding encoding)

{
  codecvt *this_00;
  long lVar1;
  locale local_50 [3];
  locale local_38;
  locale local_30;
  locale local_28;
  locale prevLocale;
  Encoding encoding_local;
  string *data_local;
  cmGeneratedFileStream *this_local;
  
  prevLocale._M_impl._4_4_ = encoding;
  std::ios_base::getloc((ios_base *)&local_38);
  this_00 = (codecvt *)operator_new(0x20);
  codecvt::codecvt(this_00,prevLocale._M_impl._4_4_);
  std::locale::locale<codecvt>(&local_30,&local_38,this_00);
  std::ios::imbue(&local_28);
  std::locale::~locale(&local_30);
  std::locale::~locale(&local_38);
  lVar1 = std::__cxx11::string::data();
  std::__cxx11::string::size();
  std::ostream::write((char *)this,lVar1);
  std::ios::imbue(local_50);
  std::locale::~locale(local_50);
  std::locale::~locale(&local_28);
  return;
}

Assistant:

void cmGeneratedFileStream::WriteAltEncoding(std::string const& data,
                                             Encoding encoding)
{
#ifndef CMAKE_BOOTSTRAP
  std::locale prevLocale =
    this->imbue(std::locale(this->getloc(), new codecvt(encoding)));
  this->write(data.data(), data.size());
  this->imbue(prevLocale);
#else
  static_cast<void>(encoding);
  this->write(data.data(), data.size());
#endif
}